

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

Precision __thiscall
spirv_cross::CompilerGLSL::analyze_expression_precision
          (CompilerGLSL *this,uint32_t *args,uint32_t length)

{
  Types TVar1;
  bool bVar2;
  Precision PVar3;
  bool bVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  
  if (length == 0) {
    return DontCare;
  }
  uVar5 = 0;
  bVar4 = false;
  bVar2 = false;
  bVar6 = 0;
  bVar7 = 0;
  do {
    TVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[args[uVar5]].
            type;
    if ((TypeUndef < TVar1) || ((0x1208U >> (TVar1 & 0x1f) & 1) == 0)) {
      bVar2 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)args[uVar5],DecorationRelaxedPrecision);
      if (bVar2) {
        bVar6 = 1;
        bVar7 = bVar6;
        bVar2 = bVar4;
      }
      else {
        bVar4 = true;
        bVar2 = true;
        bVar7 = bVar6;
      }
    }
    uVar5 = uVar5 + 1;
  } while (length != uVar5);
  PVar3 = Highp;
  if (!bVar2) {
    PVar3 = (uint)bVar7 * 2;
  }
  return PVar3;
}

Assistant:

CompilerGLSL::Options::Precision CompilerGLSL::analyze_expression_precision(const uint32_t *args, uint32_t length) const
{
	// Now, analyze the precision at which the arguments would run.
	// GLSL rules are such that the precision used to evaluate an expression is equal to the highest precision
	// for the inputs. Constants do not have inherent precision and do not contribute to this decision.
	// If all inputs are constants, they inherit precision from outer expressions, including an l-value.
	// In this case, we'll have to force a temporary for dst_id so that we can bind the constant expression with
	// correct precision.
	bool expression_has_highp = false;
	bool expression_has_mediump = false;

	for (uint32_t i = 0; i < length; i++)
	{
		uint32_t arg = args[i];

		auto handle_type = ir.ids[arg].get_type();
		if (handle_type == TypeConstant || handle_type == TypeConstantOp || handle_type == TypeUndef)
			continue;

		if (has_decoration(arg, DecorationRelaxedPrecision))
			expression_has_mediump = true;
		else
			expression_has_highp = true;
	}

	if (expression_has_highp)
		return Options::Highp;
	else if (expression_has_mediump)
		return Options::Mediump;
	else
		return Options::DontCare;
}